

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O3

Vec_Wrd_t * Abc_SuppDiffMatrix(Vec_Wrd_t *vCubes)

{
  ulong *puVar1;
  ulong *puVar2;
  int iVar3;
  ulong *__src;
  ulong *puVar4;
  Vec_Wrd_t *pVVar5;
  word *__dest;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong *puVar9;
  int level;
  long lVar10;
  size_t __size;
  ulong *puVar11;
  timespec ts;
  timespec local_40;
  
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  puVar11 = vCubes->pArray;
  iVar3 = vCubes->nSize;
  uVar6 = ((iVar3 + -1) * iVar3) / 2;
  uVar8 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar8 = uVar6;
  }
  lVar10 = (long)(int)uVar8;
  if (uVar8 == 0) {
    __src = (ulong *)0x0;
  }
  else {
    __src = (ulong *)malloc(lVar10 * 8);
  }
  puVar4 = __src;
  if (0 < iVar3) {
    puVar2 = puVar11 + iVar3;
    do {
      puVar1 = puVar11 + 1;
      puVar9 = puVar1;
      if (puVar2 <= puVar1) break;
      do {
        *puVar4 = *puVar9 ^ *puVar11;
        puVar4 = puVar4 + 1;
        puVar9 = puVar9 + 1;
      } while (puVar9 < puVar2);
      puVar11 = puVar1;
    } while (puVar1 < puVar2);
  }
  if (puVar4 != __src + lVar10) {
    __assert_fail("pStore == Vec_WrdLimit(vPairs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilSupp.c"
                  ,0x176,"Vec_Wrd_t *Abc_SuppDiffMatrix(Vec_Wrd_t *)");
  }
  pVVar5 = (Vec_Wrd_t *)malloc(0x10);
  pVVar5->nSize = uVar8;
  pVVar5->nCap = uVar8;
  if (uVar8 == 0) {
    __size = 0;
    __dest = (word *)0x0;
  }
  else {
    __size = lVar10 << 3;
    __dest = (word *)malloc(__size);
  }
  pVVar5->pArray = __dest;
  memcpy(__dest,__src,__size);
  printf("Successfully generated diff matrix with %10d rows (%6.2f %%).  ",
         ((double)(int)uVar8 * 100.0) / (double)(int)uVar8,(ulong)uVar8);
  level = 3;
  iVar3 = clock_gettime(3,&local_40);
  if (iVar3 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar10 + lVar7) / 1000000.0);
  if (__src != (ulong *)0x0) {
    free(__src);
  }
  return pVVar5;
}

Assistant:

Vec_Wrd_t * Abc_SuppDiffMatrix( Vec_Wrd_t * vCubes )
{
    abctime clk = Abc_Clock();
    word * pEnt2, * pEnt = Vec_WrdArray( vCubes );
    word * pLimit = Vec_WrdLimit( vCubes );
    Vec_Wrd_t * vRes, * vPairs = Vec_WrdAlloc( Vec_WrdSize(vCubes) * (Vec_WrdSize(vCubes) - 1) / 2 );
    word * pStore = Vec_WrdArray( vPairs );
    for ( ; pEnt < pLimit; pEnt++ )
    for ( pEnt2 = pEnt+1; pEnt2 < pLimit; pEnt2++ )
        *pStore++ = *pEnt ^ *pEnt2;
    vPairs->nSize = Vec_WrdCap(vPairs);
    assert( pStore == Vec_WrdLimit(vPairs) );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
//    vRes = Vec_WrdUniqifyHash( vPairs, 1 );
    vRes = Vec_WrdDup( vPairs );
    printf( "Successfully generated diff matrix with %10d rows (%6.2f %%).  ", 
        Vec_WrdSize(vRes), 100.0 * Vec_WrdSize(vRes) / Vec_WrdSize(vPairs) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Vec_WrdFree( vPairs );
    return vRes;    
}